

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBm.c
# Opt level: O1

int checkEquivalence(Abc_Ntk_t *pNtk1,Vec_Int_t *matchedInputs1,Vec_Int_t *matchedOutputs1,
                    Abc_Ntk_t *pNtk2,Vec_Int_t *matchedInputs2,Vec_Int_t *matchedOutputs2)

{
  uint uVar1;
  void *pvVar2;
  uint uVar3;
  int iVar4;
  Vec_Ptr_t *iMatchPairs;
  void **ppvVar5;
  Vec_Ptr_t *oMatchPairs;
  char *__s;
  int iVar6;
  long lVar7;
  
  iVar4 = pNtk1->vPis->nSize;
  iVar6 = iVar4 * 2;
  iMatchPairs = (Vec_Ptr_t *)malloc(0x10);
  if (iVar4 * 2 - 1U < 7) {
    iVar6 = 8;
  }
  iMatchPairs->nSize = 0;
  iMatchPairs->nCap = iVar6;
  if (iVar6 == 0) {
    ppvVar5 = (void **)0x0;
  }
  else {
    ppvVar5 = (void **)malloc((long)iVar6 << 3);
  }
  iMatchPairs->pArray = ppvVar5;
  iVar4 = pNtk1->vPos->nSize;
  iVar6 = iVar4 * 2;
  oMatchPairs = (Vec_Ptr_t *)malloc(0x10);
  if (iVar4 * 2 - 1U < 7) {
    iVar6 = 8;
  }
  oMatchPairs->nSize = 0;
  oMatchPairs->nCap = iVar6;
  if (iVar6 == 0) {
    ppvVar5 = (void **)0x0;
  }
  else {
    ppvVar5 = (void **)malloc((long)iVar6 << 3);
  }
  oMatchPairs->pArray = ppvVar5;
  if (0 < pNtk1->vPis->nSize) {
    lVar7 = 0;
    do {
      if (matchedInputs2->nSize <= lVar7) goto LAB_0029c19c;
      iVar4 = matchedInputs2->pArray[lVar7];
      if (((long)iVar4 < 0) || (pNtk2->vPis->nSize <= iVar4)) goto LAB_0029c17d;
      pvVar2 = pNtk2->vPis->pArray[iVar4];
      uVar3 = iMatchPairs->nCap;
      if (iMatchPairs->nSize == uVar3) {
        if ((int)uVar3 < 0x10) {
          if (iMatchPairs->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc(0x80);
          }
          else {
            ppvVar5 = (void **)realloc(iMatchPairs->pArray,0x80);
          }
          iVar4 = 0x10;
        }
        else {
          iVar4 = uVar3 * 2;
          if (iVar4 <= (int)uVar3) goto LAB_0029be74;
          if (iMatchPairs->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc((ulong)uVar3 << 4);
          }
          else {
            ppvVar5 = (void **)realloc(iMatchPairs->pArray,(ulong)uVar3 << 4);
          }
        }
        iMatchPairs->pArray = ppvVar5;
        iMatchPairs->nCap = iVar4;
      }
LAB_0029be74:
      iVar4 = iMatchPairs->nSize;
      uVar3 = iVar4 + 1;
      iMatchPairs->nSize = uVar3;
      iMatchPairs->pArray[iVar4] = pvVar2;
      if (matchedInputs1->nSize <= lVar7) goto LAB_0029c19c;
      iVar4 = matchedInputs1->pArray[lVar7];
      if (((long)iVar4 < 0) || (pNtk1->vPis->nSize <= iVar4)) goto LAB_0029c17d;
      pvVar2 = pNtk1->vPis->pArray[iVar4];
      uVar1 = iMatchPairs->nCap;
      if (uVar3 == uVar1) {
        if ((int)uVar1 < 0x10) {
          if (iMatchPairs->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc(0x80);
          }
          else {
            ppvVar5 = (void **)realloc(iMatchPairs->pArray,0x80);
          }
          iVar4 = 0x10;
        }
        else {
          iVar4 = uVar1 * 2;
          if (iVar4 <= (int)uVar1) goto LAB_0029bf1f;
          if (iMatchPairs->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc((ulong)uVar1 << 4);
          }
          else {
            ppvVar5 = (void **)realloc(iMatchPairs->pArray,(ulong)uVar1 << 4);
          }
        }
        iMatchPairs->pArray = ppvVar5;
        iMatchPairs->nCap = iVar4;
      }
LAB_0029bf1f:
      iVar4 = iMatchPairs->nSize;
      iMatchPairs->nSize = iVar4 + 1;
      iMatchPairs->pArray[iVar4] = pvVar2;
      lVar7 = lVar7 + 1;
    } while (lVar7 < pNtk1->vPis->nSize);
  }
  if (0 < pNtk1->vPos->nSize) {
    lVar7 = 0;
    do {
      if (matchedOutputs2->nSize <= lVar7) {
LAB_0029c19c:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar4 = matchedOutputs2->pArray[lVar7];
      if (((long)iVar4 < 0) || (pNtk2->vPos->nSize <= iVar4)) {
LAB_0029c17d:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar2 = pNtk2->vPos->pArray[iVar4];
      uVar3 = oMatchPairs->nCap;
      if (oMatchPairs->nSize == uVar3) {
        if ((int)uVar3 < 0x10) {
          if (oMatchPairs->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc(0x80);
          }
          else {
            ppvVar5 = (void **)realloc(oMatchPairs->pArray,0x80);
          }
          iVar4 = 0x10;
        }
        else {
          iVar4 = uVar3 * 2;
          if (iVar4 <= (int)uVar3) goto LAB_0029c011;
          if (oMatchPairs->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc((ulong)uVar3 << 4);
          }
          else {
            ppvVar5 = (void **)realloc(oMatchPairs->pArray,(ulong)uVar3 << 4);
          }
        }
        oMatchPairs->pArray = ppvVar5;
        oMatchPairs->nCap = iVar4;
      }
LAB_0029c011:
      iVar4 = oMatchPairs->nSize;
      uVar3 = iVar4 + 1;
      oMatchPairs->nSize = uVar3;
      oMatchPairs->pArray[iVar4] = pvVar2;
      if (matchedOutputs1->nSize <= lVar7) goto LAB_0029c19c;
      iVar4 = matchedOutputs1->pArray[lVar7];
      if (((long)iVar4 < 0) || (pNtk1->vPos->nSize <= iVar4)) goto LAB_0029c17d;
      pvVar2 = pNtk1->vPos->pArray[iVar4];
      uVar1 = oMatchPairs->nCap;
      if (uVar3 == uVar1) {
        if ((int)uVar1 < 0x10) {
          if (oMatchPairs->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc(0x80);
          }
          else {
            ppvVar5 = (void **)realloc(oMatchPairs->pArray,0x80);
          }
          iVar4 = 0x10;
        }
        else {
          iVar4 = uVar1 * 2;
          if (iVar4 <= (int)uVar1) goto LAB_0029c0ba;
          if (oMatchPairs->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc((ulong)uVar1 << 4);
          }
          else {
            ppvVar5 = (void **)realloc(oMatchPairs->pArray,(ulong)uVar1 << 4);
          }
        }
        oMatchPairs->pArray = ppvVar5;
        oMatchPairs->nCap = iVar4;
      }
LAB_0029c0ba:
      iVar4 = oMatchPairs->nSize;
      oMatchPairs->nSize = iVar4 + 1;
      oMatchPairs->pArray[iVar4] = pvVar2;
      lVar7 = lVar7 + 1;
    } while (lVar7 < pNtk1->vPos->nSize);
  }
  iVar4 = Abc_NtkBmSat(pNtk1,pNtk2,iMatchPairs,oMatchPairs,(Vec_Int_t *)0x0,0);
  __s = "*** Circuits are equivalent ***";
  if (iVar4 == 0) {
    __s = "*** Circuits are NOT equivalent ***";
  }
  puts(__s);
  if (iMatchPairs->pArray != (void **)0x0) {
    free(iMatchPairs->pArray);
    iMatchPairs->pArray = (void **)0x0;
  }
  free(iMatchPairs);
  if (oMatchPairs->pArray != (void **)0x0) {
    free(oMatchPairs->pArray);
    oMatchPairs->pArray = (void **)0x0;
  }
  free(oMatchPairs);
  return iVar4;
}

Assistant:

int checkEquivalence( Abc_Ntk_t * pNtk1, Vec_Int_t* matchedInputs1, Vec_Int_t * matchedOutputs1,
                       Abc_Ntk_t * pNtk2, Vec_Int_t* matchedInputs2, Vec_Int_t * matchedOutputs2)
{    
    Vec_Ptr_t * iMatchPairs, * oMatchPairs;
    int i;
    int result;

    iMatchPairs = Vec_PtrAlloc( Abc_NtkPiNum( pNtk1 ) * 2);
    oMatchPairs = Vec_PtrAlloc( Abc_NtkPoNum( pNtk1 ) * 2);

    for(i = 0; i < Abc_NtkPiNum(pNtk1); i++)
    {    
        Vec_PtrPush(iMatchPairs, Abc_NtkPi(pNtk2, Vec_IntEntry(matchedInputs2, i)));
        Vec_PtrPush(iMatchPairs, Abc_NtkPi(pNtk1, Vec_IntEntry(matchedInputs1, i)));
    }
                

    for(i = 0; i < Abc_NtkPoNum(pNtk1); i++)        
    {
        Vec_PtrPush(oMatchPairs, Abc_NtkPo(pNtk2, Vec_IntEntry(matchedOutputs2, i)));
        Vec_PtrPush(oMatchPairs, Abc_NtkPo(pNtk1, Vec_IntEntry(matchedOutputs1, i)));
    }        

    result = Abc_NtkBmSat(pNtk1, pNtk2, iMatchPairs, oMatchPairs, NULL, 0);

    if( result )
        printf("*** Circuits are equivalent ***\n");
    else
        printf("*** Circuits are NOT equivalent ***\n");

    Vec_PtrFree( iMatchPairs );
    Vec_PtrFree( oMatchPairs );    

    return result;
}